

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.h
# Opt level: O1

ValidPointers<SmallAllocationBlockAttributes> __thiscall
Memory::HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::GetValidPointersForIndex
          (ValidPointersMap<SmallAllocationBlockAttributes> *this,uint bucketIndex)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *in_FS_OFFSET;
  ValidPointers<SmallAllocationBlockAttributes> local_30;
  
  if (0x2f < bucketIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0x17c,"(bucketIndex < TBlockAttributes::BucketCount)",
                       "bucketIndex < TBlockAttributes::BucketCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  ValidPointers<SmallAllocationBlockAttributes>::ValidPointers
            (&local_30,this->validPointersBuffer[bucketIndex],bucketIndex);
  return local_30;
}

Assistant:

inline const ValidPointers<TBlockAttributes> GetValidPointersForIndex(uint bucketIndex) const
        {
            AnalysisAssert(bucketIndex < TBlockAttributes::BucketCount);
            ushort const * validPointers = nullptr;
#if USE_VPM_TABLE
            validPointers = validPointersBuffer[bucketIndex];
#endif
            return ValidPointers<TBlockAttributes>(validPointers, bucketIndex);
        }